

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_context.c
# Opt level: O3

SUNErrCode SUNContext_Free(SUNContext *sunctx)

{
  SUNContext sunctx_00;
  
  if ((sunctx != (SUNContext *)0x0) && (sunctx_00 = *sunctx, sunctx_00 != (SUNContext)0x0)) {
    if ((sunctx_00->logger != (SUNLogger)0x0) && (sunctx_00->own_logger != 0)) {
      SUNLogger_Destroy(&sunctx_00->logger);
      sunctx_00 = *sunctx;
    }
    SUNContext_ClearErrHandlers(sunctx_00);
    free(*sunctx);
    *sunctx = (SUNContext)0x0;
  }
  return 0;
}

Assistant:

SUNErrCode SUNContext_Free(SUNContext* sunctx)
{
#ifdef SUNDIALS_ADIAK_ENABLED
  adiak_fini();
#endif

  if (!sunctx || !(*sunctx)) { return SUN_SUCCESS; }

#if defined(SUNDIALS_BUILD_WITH_PROFILING) && !defined(SUNDIALS_CALIPER_ENABLED)
  /* Find out where we are printing to */
  FILE* fp                    = NULL;
  char* sunprofiler_print_env = getenv("SUNPROFILER_PRINT");
  fp                          = NULL;
  if (sunprofiler_print_env)
  {
    if (!strcmp(sunprofiler_print_env, "0")) { fp = NULL; }
    else if (!strcmp(sunprofiler_print_env, "1") ||
             !strcmp(sunprofiler_print_env, "TRUE") ||
             !strcmp(sunprofiler_print_env, "stdout"))
    {
      fp = stdout;
    }
    else { fp = fopen(sunprofiler_print_env, "a"); }
  }

  /* Enforce that the profiler is freed before finalizing,
     if it is not owned by the sunctx. */
  if ((*sunctx)->profiler)
  {
    if (fp) { SUNProfiler_Print((*sunctx)->profiler, fp); }
    if (fp) { fclose(fp); }
    if ((*sunctx)->own_profiler) { SUNProfiler_Free(&(*sunctx)->profiler); }
  }
#endif

  if ((*sunctx)->logger && (*sunctx)->own_logger)
  {
    SUNLogger_Destroy(&(*sunctx)->logger);
  }

  SUNContext_ClearErrHandlers(*sunctx);

  free(*sunctx);
  *sunctx = NULL;

  return SUN_SUCCESS;
}